

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::double_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,align_spec *spec,double_writer *f)

{
  byte bVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  size_t __n;
  size_t size;
  char *pcVar6;
  char __tmp;
  size_t __len_1;
  char *__dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  ptrdiff_t _Num_2;
  size_t __n_00;
  size_t __len;
  size_t __n_01;
  
  uVar2 = spec->width_;
  uVar5 = (f->buffer->size_ + 1) - (ulong)(f->sign == '\0');
  plVar3 = *(long **)this;
  lVar4 = plVar3[1];
  __n_01 = uVar2 - uVar5;
  if (uVar2 < uVar5 || __n_01 == 0) {
    std::__cxx11::string::resize((ulong)plVar3,(char)uVar5 + (char)lVar4);
    __dest = (char *)(lVar4 + *plVar3);
    if (f->sign != '\0') {
      *__dest = f->sign;
      __dest = __dest + 1;
      f->n = f->n - 1;
    }
    __n = f->buffer->size_;
    if (__n == 0) {
      return;
    }
    pcVar6 = f->buffer->ptr_;
LAB_0011c384:
    memmove(__dest,pcVar6,__n);
    return;
  }
  std::__cxx11::string::resize((ulong)plVar3,(char)uVar2 + (char)lVar4);
  pcVar6 = (char *)(lVar4 + *plVar3);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar5 = __n_01 >> 1;
    if (1 < __n_01) {
      memset(pcVar6,(uint)bVar1,uVar5);
      pcVar6 = pcVar6 + uVar5;
    }
    if (f->sign != '\0') {
      *pcVar6 = f->sign;
      pcVar6 = pcVar6 + 1;
      f->n = f->n - 1;
    }
    __n_00 = f->buffer->size_;
    if (__n_00 != 0) {
      memmove(pcVar6,f->buffer->ptr_,__n_00);
    }
    __n_01 = __n_01 - uVar5;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      __dest = pcVar6 + __n_01;
      memset(pcVar6,(uint)bVar1,__n_01);
      if (f->sign != '\0') {
        *__dest = f->sign;
        __dest = __dest + 1;
        f->n = f->n - 1;
      }
      __n = f->buffer->size_;
      if (__n == 0) {
        return;
      }
      pcVar6 = f->buffer->ptr_;
      goto LAB_0011c384;
    }
    if (f->sign != '\0') {
      *pcVar6 = f->sign;
      pcVar6 = pcVar6 + 1;
      f->n = f->n - 1;
    }
    __n_00 = f->buffer->size_;
    if (__n_00 != 0) {
      memmove(pcVar6,f->buffer->ptr_,__n_00);
    }
  }
  memset(pcVar6 + __n_00,(uint)bVar1,__n_01);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }